

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  bool bVar1;
  reference ppcVar2;
  undefined8 uVar3;
  pair<std::_Rb_tree_const_iterator<const_cmDependInformation_*>,_bool> pVar4;
  bool local_e1;
  string local_d0 [35];
  byte local_ad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long local_80;
  size_type pos;
  string tmp;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  const_iterator d;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  *visited_local;
  FILE *fout_local;
  cmDependInformation *info_local;
  cmOutputRequiredFilesCommand *this_local;
  
  fout_local = (FILE *)info;
  info_local = (cmDependInformation *)this;
  pVar4 = std::
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          ::insert(visited,(value_type *)&fout_local);
  d._M_node = (_Base_ptr)pVar4.first._M_node;
  local_40._M_node =
       (_Base_ptr)
       std::
       set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
       ::begin((set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
                *)fout_local);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
         ::end((set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
                *)fout_local);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<cmDependInformation_*>::operator*(&local_40);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
         ::find(visited,ppcVar2);
    tmp.field_2._8_8_ =
         std::
         set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
         ::end(visited);
    bVar1 = std::operator==(&local_50,(_Self *)((long)&tmp.field_2 + 8));
    if (bVar1) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &fout_local->_IO_buf_end,"");
      if (bVar1) {
        ppcVar2 = std::_Rb_tree_const_iterator<cmDependInformation_*>::operator*(&local_40);
        std::__cxx11::string::string((string *)&pos,(string *)&(*ppcVar2)->FullPath);
        local_80 = std::__cxx11::string::rfind((char)&pos,0x2e);
        local_ad = 0;
        local_e1 = false;
        if (local_80 != -1) {
          std::__cxx11::string::substr((ulong)&local_a0,(ulong)&pos);
          local_ad = 1;
          local_e1 = std::operator!=(&local_a0,".h");
        }
        if ((local_ad & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a0);
        }
        if (local_e1 != false) {
          std::__cxx11::string::substr((ulong)local_d0,(ulong)&pos);
          std::__cxx11::string::operator=((string *)&pos,local_d0);
          std::__cxx11::string::~string(local_d0);
          std::_Rb_tree_const_iterator<cmDependInformation_*>::operator*(&local_40);
          uVar3 = std::__cxx11::string::c_str();
          fprintf((FILE *)fout,"%s\n",uVar3);
        }
        std::__cxx11::string::~string((string *)&pos);
      }
      ppcVar2 = std::_Rb_tree_const_iterator<cmDependInformation_*>::operator*(&local_40);
      ListDependencies(this,*ppcVar2,fout,visited);
    }
    std::_Rb_tree_const_iterator<cmDependInformation_*>::operator++(&local_40);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation::DependencySetType::const_iterator d =
         info->DependencySet.begin();
       d != info->DependencySet.end(); ++d) {
    if (visited->find(*d) == visited->end()) {
      if (info->FullPath != "") {
        std::string tmp = (*d)->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", (*d)->FullPath.c_str());
        }
      }
      this->ListDependencies(*d, fout, visited);
    }
  }
}